

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSlidingWindowsLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ActivationLinear *pAVar2;
  bool bVar3;
  LayerUnion LVar4;
  long *plVar5;
  long lVar6;
  size_type *psVar7;
  string err;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  undefined1 local_88 [24];
  pointer local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Result::Result((Result *)&local_70);
  validateInputCount((Result *)local_98,layer,1,1);
  local_70 = (pointer)local_98;
  std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
  if (local_90._M_p != local_88 + 8) {
    operator_delete(local_90._M_p,local_88._8_8_ + 1);
  }
  bVar3 = Result::good((Result *)&local_70);
  if (bVar3) {
    validateOutputCount((Result *)local_98,layer,1,1);
    local_70 = (pointer)local_98;
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
    if (local_90._M_p != local_88 + 8) {
      operator_delete(local_90._M_p,local_88._8_8_ + 1);
    }
  }
  if (layer->_oneof_case_[0] == 0x3ed) {
    LVar4 = layer->layer_;
  }
  else {
    LVar4.slidingwindows_ = Specification::SlidingWindowsLayerParams::default_instance();
  }
  if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
    pAVar2 = ((LVar4.activation_)->NonlinearityType_).linear_;
    lVar6 = (long)*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                 [0] + 0x24);
    if ((SBORROW8((long)pAVar2,-lVar6) !=
         (long)&(pAVar2->super_MessageLite)._vptr_MessageLite + lVar6 < 0) ||
       (lVar6 <= (long)pAVar2)) {
      std::operator+(&local_48,
                     "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                     (layer->name_).ptr_);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        local_88._0_8_ = *psVar7;
        local_88._8_8_ = plVar5[3];
        local_98 = (undefined1  [8])local_88;
      }
      else {
        local_88._0_8_ = *psVar7;
        local_98 = (undefined1  [8])*plVar5;
      }
      local_90._M_p = (pointer)plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
      if (local_98 != (undefined1  [8])local_88) {
        operator_delete((void *)local_98,local_88._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_p == &local_58) {
        return __return_storage_ptr__;
      }
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
  *(pointer *)__return_storage_ptr__ = local_70;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p == &local_58) {
    paVar1->_M_allocated_capacity = local_58._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_58._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_68._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         local_58._M_allocated_capacity;
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_60;
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSlidingWindowsLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.slidingwindows();
    // axis should be in range [-inputRank : inputRank)
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}